

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall Chainstate::InitCoinsCache(Chainstate *this,size_t cache_size_bytes)

{
  long lVar1;
  bool bVar2;
  CoinsViews *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RSI,in_RDI,in_stack_ffffffffffffffdc,
             (AnnotatedMixin<std::recursive_mutex> *)0x7ce089);
  bVar2 = std::operator==((unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *)in_RSI,in_RDI)
  ;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("m_coins_views != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x7bc,"void Chainstate::InitCoinsCache(size_t)");
  }
  *(CoinsViews **)(in_RDI + 0xd0) = in_RSI;
  std::unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_>::operator->
            ((unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *)
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  CoinsViews::InitCache(in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::InitCoinsCache(size_t cache_size_bytes)
{
    AssertLockHeld(::cs_main);
    assert(m_coins_views != nullptr);
    m_coinstip_cache_size_bytes = cache_size_bytes;
    m_coins_views->InitCache();
}